

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

curl_slist * cookie_list(Curl_easy *data)

{
  Cookie *co;
  char *data_00;
  curl_slist *pcVar1;
  char *line;
  Cookie *c;
  Curl_llist_node *n;
  uint i;
  curl_slist *beg;
  curl_slist *list;
  Curl_easy *data_local;
  
  beg = (curl_slist *)0x0;
  if ((data->cookies == (CookieInfo *)0x0) || (data->cookies->numcookies == 0)) {
    data_local = (Curl_easy *)0x0;
  }
  else {
    for (n._4_4_ = 0; n._4_4_ < 0x3f; n._4_4_ = n._4_4_ + 1) {
      for (c = (Cookie *)Curl_llist_head(data->cookies->cookielist + n._4_4_); c != (Cookie *)0x0;
          c = (Cookie *)Curl_node_next(&c->node)) {
        co = (Cookie *)Curl_node_elem(&c->node);
        pcVar1 = beg;
        if (co->domain != (char *)0x0) {
          data_00 = get_netscape_format(co);
          if (data_00 == (char *)0x0) {
            curl_slist_free_all(beg);
            return (curl_slist *)0x0;
          }
          pcVar1 = Curl_slist_append_nodup(beg,data_00);
          if (pcVar1 == (curl_slist *)0x0) {
            (*Curl_cfree)(data_00);
            curl_slist_free_all(beg);
            return (curl_slist *)0x0;
          }
        }
        beg = pcVar1;
      }
    }
    data_local = (Curl_easy *)beg;
  }
  return (curl_slist *)data_local;
}

Assistant:

static struct curl_slist *cookie_list(struct Curl_easy *data)
{
  struct curl_slist *list = NULL;
  struct curl_slist *beg;
  unsigned int i;
  struct Curl_llist_node *n;

  if(!data->cookies || (data->cookies->numcookies == 0))
    return NULL;

  for(i = 0; i < COOKIE_HASH_SIZE; i++) {
    for(n = Curl_llist_head(&data->cookies->cookielist[i]); n;
        n = Curl_node_next(n)) {
      struct Cookie *c = Curl_node_elem(n);
      char *line;
      if(!c->domain)
        continue;
      line = get_netscape_format(c);
      if(!line) {
        curl_slist_free_all(list);
        return NULL;
      }
      beg = Curl_slist_append_nodup(list, line);
      if(!beg) {
        free(line);
        curl_slist_free_all(list);
        return NULL;
      }
      list = beg;
    }
  }

  return list;
}